

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void __thiscall dlib::string_cast_error::string_cast_error(string_cast_error *this,string *str)

{
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_stack_ffffffffffffffa0;
  error_type in_stack_ffffffffffffffac;
  error *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffb0;
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::operator+(__lhs,in_RDI);
  error::error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  *(undefined ***)in_RDI = &PTR__string_cast_error_0038dcd0;
  return;
}

Assistant:

string_cast_error(const std::string& str):
            error(ESTRING_CAST,"string cast error: invalid string = '" + str + "'") {}